

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O0

bool __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<1>::
EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<1> *this,PointDVectorIterator begin,
          PointDVectorIterator end,uint32_t *bit_length,EncoderBuffer *buffer)

{
  size_t sVar1;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  EncoderBuffer *in_stack_00000018;
  DynamicIntegerPointsKdTreeEncoder<1> *in_stack_00000400;
  PointDVectorIterator in_stack_00000410;
  PointDVectorIterator in_stack_00000428;
  DirectBitEncoder *this_00;
  uint *in_stack_ffffffffffffff90;
  EncoderBuffer *this_01;
  
  this_01 = (EncoderBuffer *)&stack0x00000020;
  *in_RDI = *in_RSI;
  sVar1 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                    ((PointDVectorIterator *)this_01,(PointDVectorIterator *)&stack0x00000008);
  in_RDI[1] = (int)sVar1;
  EncoderBuffer::Encode<unsigned_int>(this_01,in_stack_ffffffffffffff90);
  EncoderBuffer::Encode<unsigned_int>(this_01,in_stack_ffffffffffffff90);
  if (in_RDI[1] != 0) {
    DirectBitEncoder::StartEncoding((DirectBitEncoder *)0x2272d5);
    DirectBitEncoder::StartEncoding((DirectBitEncoder *)0x2272e3);
    DirectBitEncoder::StartEncoding((DirectBitEncoder *)0x2272f1);
    DirectBitEncoder::StartEncoding((DirectBitEncoder *)0x2272ff);
    this_00 = *(DirectBitEncoder **)
               &(this_01->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl;
    EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
              (in_stack_00000400,in_stack_00000410,in_stack_00000428);
    DirectBitEncoder::EndEncoding(this_00,in_stack_00000018);
    DirectBitEncoder::EndEncoding(this_00,in_stack_00000018);
    DirectBitEncoder::EndEncoding(this_00,in_stack_00000018);
    DirectBitEncoder::EndEncoding(this_00,in_stack_00000018);
  }
  return true;
}

Assistant:

bool DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodePoints(
    RandomAccessIteratorT begin, RandomAccessIteratorT end,
    const uint32_t &bit_length, EncoderBuffer *buffer) {
  bit_length_ = bit_length;
  num_points_ = static_cast<uint32_t>(end - begin);

  buffer->Encode(bit_length_);
  buffer->Encode(num_points_);
  if (num_points_ == 0) {
    return true;
  }

  numbers_encoder_.StartEncoding();
  remaining_bits_encoder_.StartEncoding();
  axis_encoder_.StartEncoding();
  half_encoder_.StartEncoding();

  EncodeInternal(begin, end);

  numbers_encoder_.EndEncoding(buffer);
  remaining_bits_encoder_.EndEncoding(buffer);
  axis_encoder_.EndEncoding(buffer);
  half_encoder_.EndEncoding(buffer);

  return true;
}